

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsConstructObject(JsValueRef function,JsValueRef *args,ushort cargs,JsValueRef *result)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  JsrtContext *pJVar6;
  RecyclableObject *pRVar7;
  Var pvVar8;
  JavascriptFunction *v;
  undefined4 *puVar9;
  JsErrorCode exitStatus;
  ulong uVar10;
  void *unaff_retaddr;
  Arguments local_c8;
  undefined1 auStack_b8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  pJVar6 = JsrtContext::GetCurrent();
  if (pJVar6 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
    goto LAB_0036fcf7;
  }
  scriptContext = (((pJVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_b8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTConstructCall
              (scriptContext->threadContext->TTDLog,
               (TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,function,(uint)cargs,
               args);
  }
  if (function == (JsValueRef)0x0) {
LAB_0036fcd7:
    exitStatus = JsErrorInvalidArgument;
  }
  else {
    bVar4 = Js::VarIs<Js::JavascriptFunction>(function);
    if (!bVar4) goto LAB_0036fcd7;
    pRVar7 = Js::VarTo<Js::RecyclableObject>(function);
    pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
    if (pSVar1 == scriptContext) {
LAB_0036fcb9:
      if (result == (JsValueRef *)0x0) {
        exitStatus = JsErrorNullArgument;
      }
      else {
        *result = (JsValueRef)0x0;
        if (args == (JsValueRef *)0x0 || cargs == 0) goto LAB_0036fcd7;
        for (uVar10 = 0; cargs != uVar10; uVar10 = uVar10 + 1) {
          pvVar8 = args[uVar10];
          if (pvVar8 == (Var)0x0) goto LAB_0036fcd7;
          if ((ulong)pvVar8 >> 0x30 == 0) {
            pRVar7 = Js::VarTo<Js::RecyclableObject>(pvVar8);
            pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     scriptContext.ptr;
            if (pSVar1 != scriptContext) {
              if (pSVar1->threadContext != scriptContext->threadContext) {
                exitStatus = JsErrorWrongRuntime;
                goto LAB_0036fcdd;
              }
              pvVar8 = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
              args[uVar10] = pvVar8;
            }
          }
        }
        v = Js::VarTo<Js::JavascriptFunction>(function);
        local_c8.Info = (Type)((ulong)cargs | 0x1000000);
        pTVar2 = scriptContext->threadContext;
        bVar4 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        local_c8.Values = args;
        pvVar8 = Js::JavascriptFunction::CallAsConstructor
                           (v,(Var)0x0,&local_c8,scriptContext,(AuxArray<unsigned_int> *)0x0);
        *result = pvVar8;
        pTVar2->reentrancySafeOrHandled = bVar4;
        if (pvVar8 != (Var)0x0) {
          BVar5 = Js::CrossSite::NeedMarshalVar(pvVar8,scriptContext);
          if (BVar5 != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar9 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                               ,0xb4d,
                               "(*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext))"
                               ,
                               "*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext)"
                              );
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar9 = 0;
          }
        }
        exitStatus = JsNoError;
        if (scriptContext->TTDShouldPerformRecordAction == true) {
          TTD::TTDJsRTActionResultAutoRecorder::SetResult
                    ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,result);
        }
      }
    }
    else {
      exitStatus = JsErrorWrongRuntime;
      if (pSVar1->threadContext == scriptContext->threadContext) {
        function = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
        goto LAB_0036fcb9;
      }
    }
  }
LAB_0036fcdd:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
LAB_0036fcf7:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsConstructObject(_In_ JsValueRef function, _In_reads_(cargs) JsValueRef *args, _In_ ushort cargs, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTConstructCall, function, cargs, args);

        VALIDATE_INCOMING_FUNCTION(function, scriptContext);
        PARAM_NOT_NULL(result);
        *result = nullptr;

        if (cargs == 0 || args == nullptr)
        {
            return JsErrorInvalidArgument;
        }

        for (int index = 0; index < cargs; index++)
        {
            VALIDATE_INCOMING_REFERENCE(args[index], scriptContext);
        }

        Js::JavascriptFunction *jsFunction = Js::VarTo<Js::JavascriptFunction>(function);
        Js::CallInfo callInfo(Js::CallFlags::CallFlags_New, cargs);
        Js::Arguments jsArgs(callInfo, reinterpret_cast<Js::Var *>(args));

        //
        //TODO: we will want to look at this at some point -- either treat as "top-level" call or maybe constructors are fast so we can just jump back to previous "real" code
        //TTDAssert(!Js::VarIs<Js::ScriptFunction>(jsFunction) || execContext->GetThreadContext()->TTDRootNestingCount != 0, "This will cause user code to execute and we need to add support for that as a top-level call source!!!!");
        //

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            *result = Js::JavascriptFunction::CallAsConstructor(jsFunction, /* overridingNewTarget = */nullptr, jsArgs, scriptContext);
        }
        END_SAFE_REENTRANT_CALL
        Assert(*result == nullptr || !Js::CrossSite::NeedMarshalVar(*result, scriptContext));

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return JsNoError;
    });
}